

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFXRefEntry.cc
# Opt level: O1

int __thiscall QPDFXRefEntry::getObjStreamNumber(QPDFXRefEntry *this)

{
  long i;
  logic_error *this_00;
  
  if (this->type == 2) {
    i = this->field1;
    if ((int)i != i) {
      QIntC::IntConverter<long_long,_int,_true,_true>::error(i);
    }
    return (int)this->field1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"getObjStreamNumber called for xref entry of type != 2");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
QPDFXRefEntry::getObjStreamNumber() const
{
    if (this->type != 2) {
        throw std::logic_error("getObjStreamNumber called for xref entry of type != 2");
    }
    return QIntC::to_int(this->field1);
}